

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

vector<FatEntry,_std::allocator<FatEntry>_> * __thiscall
FatSystem::getEntries
          (vector<FatEntry,_std::allocator<FatEntry>_> *__return_storage_ptr__,FatSystem *this,
          uint cluster,int *clusters,bool *hasFree)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  int iVar11;
  value_type *__x;
  _Rb_tree_header *p_Var12;
  long lVar13;
  unsigned_long_long uVar14;
  bool bVar15;
  char buffer [32];
  FatEntry entry;
  FatFilename filename;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  undefined1 local_224 [36];
  ulong local_200;
  string local_1f8;
  undefined1 local_1d8 [40];
  pointer local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<FatEntry,_std::allocator<FatEntry>_> local_198;
  int *local_178;
  bool *local_170;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  char local_128;
  uint local_124;
  ulong local_120;
  pointer local_118;
  size_type sStack_110;
  undefined8 local_108;
  pointer local_100;
  size_type sStack_f8;
  undefined8 local_f0;
  unsigned_long_long local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  FatFilename local_98;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.data._M_dataplus._M_p = (pointer)&local_98.data.field_2;
  local_98.data._M_string_length = 0;
  local_98.data.field_2._M_local_buf[0] = '\0';
  local_98.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (clusters != (int *)0x0) {
    *clusters = 0;
  }
  if (hasFree != (bool *)0x0) {
    *hasFree = false;
  }
  local_224._0_4_ = cluster;
  if (cluster == 0 && this->type == 0) {
    local_224._0_4_ = (undefined4)this->rootDirectory;
  }
  uVar8 = (ulong)(uint)local_224._0_4_;
  local_224._28_8_ = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar8 < this->totalClusters) {
    local_224[7] = this->type == 1 && this->rootDirectory == uVar8;
    local_224._8_4_ = CONCAT31(SUB43(local_224._0_4_,1),this->rootDirectory == uVar8);
    local_224._24_4_ = 0;
    local_224._16_4_ = 0;
    local_200 = 0;
    local_178 = clusters;
    local_170 = hasFree;
    do {
      p_Var12 = &local_60._M_impl.super__Rb_tree_header;
      uVar3 = local_224._0_4_ - 2;
      if (this->type != 0) {
        uVar3 = local_224._0_4_;
      }
      lVar13 = this->rootEntries << 5;
      if (this->type != 1) {
        lVar13 = 0;
      }
      if (local_224[7] == '\0') {
        uVar3 = local_224._0_4_ - 2;
      }
      p_Var9 = &p_Var12->_M_header;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_224[7] != '\0') {
        lVar13 = 0;
      }
      for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
          p_Var4 = (&p_Var4->_M_left)[bVar15]) {
        bVar15 = (uint)*(size_t *)(p_Var4 + 1) < (uint)local_224._0_4_;
        if (!bVar15) {
          p_Var9 = p_Var4;
        }
      }
      p_Var10 = p_Var12;
      if (((_Rb_tree_header *)p_Var9 != p_Var12) &&
         (p_Var10 = (_Rb_tree_header *)p_Var9,
         (uint)local_224._0_4_ < (uint)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
        p_Var10 = p_Var12;
      }
      if (p_Var10 == p_Var12) {
        uVar14 = this->sectorsPerCluster;
        uVar1 = this->bytesPerSector;
        uVar2 = this->dataStart;
        __x = (value_type *)local_224;
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_60,(uint *)__x);
        if (this->bytesPerCluster == 0) {
          bVar15 = false;
          local_224._12_4_ = 0;
          iVar7 = 0;
        }
        else {
          uVar14 = (ulong)uVar3 * uVar14 * uVar1 + uVar2 + lVar13;
          uVar8 = 0;
          local_224._12_4_ = 0;
          local_224._20_4_ = 0;
          bVar15 = false;
          do {
            readData(this,uVar14,local_1d8,0x20);
            FatEntry::FatEntry((FatEntry *)local_168);
            local_128 = local_1d8[0xb];
            local_e8 = uVar14;
            if (local_1d8[0xb] == '\x0f') {
              __x = (value_type *)local_1d8;
              FatFilename::append(&local_98,(char *)__x);
            }
            else {
              local_1f8.field_2._M_allocated_capacity._0_7_ = local_1d8._0_7_;
              local_1f8.field_2._M_local_buf[7] = (char)local_1d8._7_4_;
              local_1f8._M_string_length = 0xb;
              local_1f8.field_2._M_local_buf[0xb] = '\0';
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::operator=((string *)local_168,(string *)&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                CONCAT17(local_1f8.field_2._M_local_buf[7],
                                         local_1f8.field_2._M_allocated_capacity._0_7_) + 1);
              }
              FatFilename::getFilename_abi_cxx11_(&local_1f8,&local_98);
              std::__cxx11::string::operator=((string *)&local_148,(string *)&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                CONCAT17(local_1f8.field_2._M_local_buf[7],
                                         local_1f8.field_2._M_allocated_capacity._0_7_) + 1);
              }
              local_120 = (ulong)(uint)local_1d8._28_4_;
              local_124 = CONCAT13(local_1d8[0x15],CONCAT12(local_1d8[0x14],local_1d8._26_2_));
              local_1d8._32_8_ = &local_1a8;
              local_1f8._M_dataplus._M_p = (pointer)0x20;
              __x = (value_type *)(local_1d8 + 0x20);
              local_1d8._32_8_ = std::__cxx11::string::_M_create((ulong *)__x,(ulong)&local_1f8);
              local_1a8._M_allocated_capacity = (size_type)local_1f8._M_dataplus._M_p;
              *(ulong *)(local_1d8._32_8_ + 0x10) =
                   CONCAT26(local_1d8._22_2_,
                            CONCAT15(local_1d8[0x15],CONCAT14(local_1d8[0x14],local_1d8._16_4_)));
              *(ulong *)(local_1d8._32_8_ + 0x18) =
                   CONCAT44(local_1d8._28_4_,CONCAT22(local_1d8._26_2_,local_1d8._24_2_));
              *(size_type *)local_1d8._32_8_ = CONCAT17(local_1d8[7],local_1d8._0_7_);
              *(ulong *)(local_1d8._32_8_ + 8) =
                   CONCAT44(local_1d8._12_4_,CONCAT13(local_1d8[0xb],local_1d8._8_3_));
              local_1b0 = local_1f8._M_dataplus._M_p;
              *(char *)(local_1d8._32_8_ + (long)local_1f8._M_dataplus._M_p) = '\0';
              FatEntry::setData((FatEntry *)local_168,(string *)__x);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._32_8_ != &local_1a8) {
                __x = (value_type *)(local_1a8._M_allocated_capacity + 1);
                operator_delete((void *)local_1d8._32_8_,(ulong)__x);
              }
              bVar6 = FatEntry::isZero((FatEntry *)local_168);
              bVar15 = true;
              if (!bVar6) {
                bVar15 = FatEntry::isCorrect((FatEntry *)local_168);
                if ((bVar15) && ((ulong)local_124 < this->totalClusters)) {
                  FatDate::FatDate((FatDate *)&local_1f8,local_1d8 + 0x10);
                  local_108._7_1_ = local_1f8.field_2._M_local_buf[7];
                  local_108._0_7_ = local_1f8.field_2._M_allocated_capacity._0_7_;
                  local_118 = local_1f8._M_dataplus._M_p;
                  sStack_110 = local_1f8._M_string_length;
                  FatDate::FatDate((FatDate *)&local_1f8,local_1d8 + 0x16);
                  local_f0._7_1_ = local_1f8.field_2._M_local_buf[7];
                  local_f0._0_7_ = local_1f8.field_2._M_allocated_capacity._0_7_;
                  local_100 = local_1f8._M_dataplus._M_p;
                  sStack_f8 = local_1f8._M_string_length;
                  __x = (value_type *)local_168;
                  std::vector<FatEntry,_std::allocator<FatEntry>_>::push_back(&local_198,__x);
                  if ((local_224._8_4_ & 1) == 0) {
                    FatEntry::getFilename_abi_cxx11_(&local_b8,(FatEntry *)local_168);
                    __x = (value_type *)0x11770e;
                    iVar7 = std::__cxx11::string::compare((char *)&local_b8);
                    if (iVar7 != 0) goto LAB_0010cdeb;
                    bVar15 = local_124 == local_224._0_4_;
                  }
                  else {
LAB_0010cdeb:
                    bVar15 = false;
                  }
                  if (((local_224._8_4_ & 1) == 0) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
                    __x = (value_type *)(local_b8.field_2._M_allocated_capacity + 1);
                    operator_delete(local_b8._M_dataplus._M_p,(ulong)__x);
                  }
                  local_224._20_4_ = local_224._20_4_ + 1;
                  local_224._16_4_ = local_224._16_4_ + 1;
                  local_224._8_4_ = local_224._8_4_ & 0xff;
                  if (bVar15) {
                    local_224._8_4_ = 1;
                  }
                }
                else {
                  local_224._12_4_ = local_224._12_4_ + 1;
                  local_224._24_4_ = local_224._24_4_ + 1;
                }
                bVar15 = false;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_p != &local_c8) {
              __x = (value_type *)(local_c8._M_allocated_capacity + 1);
              operator_delete(local_d8._M_p,(ulong)__x);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_p != &local_138) {
              __x = (value_type *)(local_138._M_allocated_capacity + 1);
              operator_delete(local_148._M_p,(ulong)__x);
            }
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              __x = (value_type *)(local_168._16_8_ + 1);
              operator_delete((void *)local_168._0_8_,(ulong)__x);
            }
            uVar8 = (ulong)((int)uVar8 + 0x20);
            uVar14 = uVar14 + 0x20;
            iVar7 = local_224._20_4_;
          } while (uVar8 < this->bytesPerCluster);
        }
        uVar5 = local_224._0_4_;
        if (local_224[7] == '\0') {
          __x = (value_type *)(ulong)(uint)local_224._0_4_;
          local_224._0_4_ = nextCluster(this,local_224._0_4_,0);
        }
        else {
          local_224._0_4_ = local_224._0_4_ + 1;
          if (this->rootClusters <= (ulong)(uint)local_224._0_4_) {
            local_224._0_4_ = 0xffffffff;
          }
        }
        if (local_178 != (int *)0x0) {
          *local_178 = *local_178 + 1;
        }
        if ((local_224._0_4_ == 0) || ((local_200 & 1) != 0)) {
          if (local_170 != (bool *)0x0) {
            *local_170 = true;
          }
          if (iVar7 <= (int)local_224._12_4_ || (bVar15 || iVar7 == 0)) {
            local_200 = CONCAT71((int7)((ulong)__x >> 8),1);
            iVar11 = 2;
            if (local_178 != (int *)0x0 && iVar7 == 0) {
              *local_178 = *local_178 + -1;
            }
            goto LAB_0010cb08;
          }
          local_224._0_4_ = uVar5 + 1;
          local_200 = CONCAT71((int7)((ulong)local_170 >> 8),1);
        }
        iVar11 = 0;
        if (((local_224._8_4_ & 1) == 0) &&
           (iVar11 = 0, (int)local_224._16_4_ < (int)local_224._24_4_)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "! Entries don\'t look good, this is maybe not a directory",0x38);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
          super__Vector_impl_data._M_start = (pointer)0x0;
          (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar11 = 1;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"! Looping directory",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        iVar11 = 2;
      }
LAB_0010cb08:
      if (iVar11 != 0) {
        if (iVar11 != 2) goto LAB_0010d074;
        break;
      }
    } while (local_224._0_4_ != 0xffffffff);
    (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
    super__Vector_impl_data._M_start =
         local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_start;
    (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
    super__Vector_impl_data._M_finish =
         local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (((_Vector_base<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_)->_M_impl).
    super__Vector_impl_data._M_end_of_storage =
         local_198.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = &local_198;
  }
  (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0010d074:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.letters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.data._M_dataplus._M_p != &local_98.data.field_2) {
    operator_delete(local_98.data._M_dataplus._M_p,
                    CONCAT71(local_98.data.field_2._M_allocated_capacity._1_7_,
                             local_98.data.field_2._M_local_buf[0]) + 1);
  }
  std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_198);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return (vector<FatEntry,_std::allocator<FatEntry>_> *)local_224._28_8_;
}

Assistant:

vector<FatEntry> FatSystem::getEntries(unsigned int cluster, int *clusters, bool *hasFree)
{
    bool isRoot = false;
    bool contiguous = false;
    int foundEntries = 0;
    int badEntries = 0;
    bool isValid = false;
    set<unsigned int> visited;
    vector<FatEntry> entries;
    FatFilename filename;

    if (clusters != NULL) {
        *clusters = 0;
    }

    if (hasFree != NULL) {
        *hasFree = false;
    }

    if (cluster == 0 && type == FAT32) {
        cluster = rootDirectory;
    }

    isRoot = (type==FAT16 && cluster==rootDirectory);

    if (cluster == rootDirectory) {
        isValid = true;
    }

    if (!validCluster(cluster)) {
        return vector<FatEntry>();
    }

    do {
        bool localZero = false;
        int localFound = 0;
        int localBadEntries = 0;
        unsigned long long address = clusterAddress(cluster, isRoot);
        char buffer[FAT_ENTRY_SIZE];
        if (visited.find(cluster) != visited.end()) {
            cerr << "! Looping directory" << endl;
            break;
        }
        visited.insert(cluster);

        unsigned int i;
        for (i=0; i<bytesPerCluster; i+=sizeof(buffer)) {
            // Reading data
            readData(address, buffer, sizeof(buffer));

            // Creating entry
            FatEntry entry;

            entry.attributes = buffer[FAT_ATTRIBUTES];
            entry.address = address;

            if (entry.attributes == FAT_ATTRIBUTES_LONGFILE) {
                // Long file part
                filename.append(buffer);
            } else {
                entry.shortName = string(buffer, 11);
                entry.longName = filename.getFilename();
                entry.size = FAT_READ_LONG(buffer, FAT_FILESIZE)&0xffffffff;
                entry.cluster = (FAT_READ_SHORT(buffer, FAT_CLUSTER_LOW)&0xffff) | (FAT_READ_SHORT(buffer, FAT_CLUSTER_HIGH)<<16);
                entry.setData(string(buffer, sizeof(buffer)));

                if (!entry.isZero()) {
                    if (entry.isCorrect() && validCluster(entry.cluster)) {
                        entry.creationDate = FatDate(&buffer[FAT_CREATION_DATE]);
                        entry.changeDate = FatDate(&buffer[FAT_CHANGE_DATE]);
                        entries.push_back(entry);
                        localFound++;
                        foundEntries++;

                        if (!isValid && entry.getFilename() == "." && entry.cluster == cluster) {
                            isValid = true;
                        }
                    } else {
                        localBadEntries++;
                        badEntries++;
                    }

                    localZero = false;
                } else {
                    localZero = true;
                }
            }

            address += sizeof(buffer);
        }

        int previousCluster = cluster;

        if (isRoot) {
            if (cluster+1 < rootClusters) {
                cluster++;
            } else {
                cluster = FAT_LAST;
            }
        } else {
            cluster = nextCluster(cluster);
        }

        if (clusters) {
            (*clusters)++;
        }

        if (cluster == 0 || contiguous) {
            contiguous = true;

            if (hasFree != NULL) {
                *hasFree = true;
            }
            if (!localZero && localFound && localBadEntries<localFound) {
                cluster = previousCluster+1;
            } else {
                if (!localFound && clusters) {
                    (*clusters)--;
                }
                break;
            }
        }

        if (!isValid) {
            if (badEntries>foundEntries) {
                cerr << "! Entries don't look good, this is maybe not a directory" << endl;
                return vector<FatEntry>();
          }
        }
    } while (cluster != FAT_LAST);

    return entries;
}